

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  uint __c;
  const_pointer pcVar3;
  const_iterator pcVar4;
  const_iterator pcVar5;
  undefined8 *puVar6;
  size_type sVar7;
  uint *__s;
  char **ppcVar8;
  byte in_CL;
  undefined8 *in_RDX;
  StringPiece *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  int in_stack_00000008;
  int fb;
  char *p;
  int ncap;
  int nvisited;
  int i;
  char *in_stack_00000158;
  int in_stack_00000164;
  BitState *in_stack_00000168;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  PODArray<const_char_*> *in_stack_fffffffffffffef0;
  PODArray<const_char_*> *pPVar9;
  Prog *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  int len;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  bool local_b2;
  bool local_b1;
  PODArray<const_char_*> *local_90;
  int local_64;
  StringPiece local_48;
  int local_34;
  undefined8 local_30;
  byte local_22;
  byte local_21;
  StringPiece *local_18;
  bool local_1;
  
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  in_RDI[1] = in_RSI->data_;
  in_RDI[2] = in_RSI->size_;
  in_RDI[3] = *in_RDX;
  in_RDI[4] = in_RDX[1];
  local_30 = in_R9;
  local_18 = in_RSI;
  pcVar3 = StringPiece::data((StringPiece *)(in_RDI + 3));
  if (pcVar3 == (const_pointer)0x0) {
    in_RDI[3] = local_18->data_;
    in_RDI[4] = local_18->size_;
  }
  bVar1 = Prog::anchor_start((Prog *)*in_RDI);
  if (bVar1) {
    pcVar4 = StringPiece::begin((StringPiece *)(in_RDI + 3));
    pcVar5 = StringPiece::begin(local_18);
    if (pcVar4 != pcVar5) {
      return false;
    }
  }
  bVar1 = Prog::anchor_end((Prog *)*in_RDI);
  if (bVar1) {
    pcVar4 = StringPiece::end((StringPiece *)(in_RDI + 3));
    pcVar5 = StringPiece::end(local_18);
    if (pcVar4 != pcVar5) {
      return false;
    }
  }
  local_b1 = true;
  if ((local_21 & 1) == 0) {
    local_b1 = Prog::anchor_start((Prog *)*in_RDI);
  }
  *(bool *)(in_RDI + 5) = local_b1;
  local_b2 = true;
  if ((local_22 & 1) == 0) {
    local_b2 = Prog::anchor_end((Prog *)*in_RDI);
  }
  *(bool *)((long)in_RDI + 0x29) = local_b2;
  bVar1 = Prog::anchor_end((Prog *)*in_RDI);
  *(bool *)((long)in_RDI + 0x2a) = bVar1;
  in_RDI[6] = local_30;
  *(int *)(in_RDI + 7) = in_stack_00000008;
  for (local_34 = 0; len = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
      local_34 < *(int *)(in_RDI + 7); local_34 = local_34 + 1) {
    StringPiece::StringPiece(&local_48);
    puVar6 = (undefined8 *)(in_RDI[6] + (long)local_34 * 0x10);
    *puVar6 = local_48.data_;
    puVar6[1] = local_48.size_;
  }
  iVar2 = Prog::list_count((Prog *)*in_RDI);
  sVar7 = StringPiece::size(local_18);
  PODArray<unsigned_int>::PODArray
            ((PODArray<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,len);
  PODArray<unsigned_int>::operator=
            ((PODArray<unsigned_int> *)in_stack_fffffffffffffef0,
             (PODArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
            );
  PODArray<unsigned_int>::~PODArray((PODArray<unsigned_int> *)0x23ba61);
  __s = PODArray<unsigned_int>::data((PODArray<unsigned_int> *)0x23ba6f);
  memset(__s,0,(long)((iVar2 * ((int)sVar7 + 1) + 0x1f) / 0x20) << 2);
  local_64 = in_stack_00000008 << 1;
  if (local_64 < 2) {
    local_64 = 2;
  }
  PODArray<const_char_*>::PODArray
            ((PODArray<const_char_*> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,len);
  PODArray<const_char_*>::operator=
            (in_stack_fffffffffffffef0,
             (PODArray<const_char_*> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
            );
  PODArray<const_char_*>::~PODArray((PODArray<const_char_*> *)0x23bae1);
  ppcVar8 = PODArray<const_char_*>::data((PODArray<const_char_*> *)0x23baef);
  memset(ppcVar8,0,(long)local_64 << 3);
  PODArray<re2::Job>::PODArray
            ((PODArray<re2::Job> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),len
            );
  PODArray<re2::Job>::operator=
            ((PODArray<re2::Job> *)in_stack_fffffffffffffef0,
             (PODArray<re2::Job> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  PODArray<re2::Job>::~PODArray((PODArray<re2::Job> *)0x23bb3a);
  if ((*(byte *)(in_RDI + 5) & 1) == 0) {
    local_90 = (PODArray<const_char_*> *)StringPiece::data(local_18);
    while( true ) {
      pcVar3 = StringPiece::data(local_18);
      sVar7 = StringPiece::size(local_18);
      if ((PODArray<const_char_*> *)(pcVar3 + sVar7) < local_90) break;
      __c = Prog::first_byte(in_stack_ffffffffffffff00);
      if (-1 < (int)__c) {
        pcVar3 = StringPiece::data(local_18);
        sVar7 = StringPiece::size(local_18);
        if ((local_90 < (PODArray<const_char_*> *)(pcVar3 + sVar7)) &&
           (*(byte *)&(local_90->ptr_)._M_t.
                      super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                      super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
                      super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false> != __c)) {
          pPVar9 = local_90;
          in_stack_ffffffffffffff00 = (Prog *)StringPiece::data(local_18);
          sVar7 = StringPiece::size(local_18);
          local_90 = (PODArray<const_char_*> *)
                     memchr(pPVar9,__c,
                            (size_t)((long)in_stack_ffffffffffffff00 + (sVar7 - (long)local_90)));
          if (local_90 == (PODArray<const_char_*> *)0x0) {
            pcVar3 = StringPiece::data(local_18);
            sVar7 = StringPiece::size(local_18);
            local_90 = (PODArray<const_char_*> *)(pcVar3 + sVar7);
          }
        }
      }
      pPVar9 = local_90;
      ppcVar8 = PODArray<const_char_*>::operator[](local_90,in_stack_fffffffffffffeec);
      *ppcVar8 = (char *)pPVar9;
      Prog::start((Prog *)*in_RDI);
      bVar1 = TrySearch(in_stack_00000168,in_stack_00000164,in_stack_00000158);
      if (bVar1) {
        return true;
      }
      local_90 = (PODArray<const_char_*> *)
                 ((long)&(local_90->ptr_)._M_t.
                         super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
                         _M_t.
                         super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                         .super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
                         super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false> + 1);
    }
    local_1 = false;
  }
  else {
    pcVar3 = StringPiece::data(local_18);
    ppcVar8 = PODArray<const_char_*>::operator[]
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    *ppcVar8 = pcVar3;
    Prog::start((Prog *)*in_RDI);
    StringPiece::data(local_18);
    local_1 = TrySearch(in_stack_00000168,in_stack_00000164,in_stack_00000158);
  }
  return local_1;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.data() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = StringPiece();

  // Allocate scratch space.
  int nvisited = prog_->list_count() * static_cast<int>(text.size()+1);
  nvisited = (nvisited + VisitedBits-1) / VisitedBits;
  visited_ = PODArray<uint32_t>(nvisited);
  memset(visited_.data(), 0, nvisited*sizeof visited_[0]);

  int ncap = 2*nsubmatch;
  if (ncap < 2)
    ncap = 2;
  cap_ = PODArray<const char*>(ncap);
  memset(cap_.data(), 0, ncap*sizeof cap_[0]);

  // When sizeof(Job) == 16, we start with a nice round 1KiB. :)
  job_ = PODArray<Job>(64);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.data();
    return TrySearch(prog_->start(), text.data());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.data(); p <= text.data() + text.size(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.data() + text.size() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(
          memchr(p, fb, text.data() + text.size() - p));
      if (p == NULL)
        p = text.data() + text.size();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}